

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsStateChangePerfTestCases.cpp
# Opt level: O2

void __thiscall
deqp::gls::StateChangeCallPerformanceCase::logTestCase(StateChangeCallPerformanceCase *this)

{
  ostringstream *poVar1;
  TestLog *pTVar2;
  MessageBuilder *pMVar3;
  undefined1 local_198 [384];
  
  pTVar2 = ((this->super_TestCase).super_TestNode.m_testCtx)->m_log;
  poVar1 = (ostringstream *)(local_198 + 8);
  local_198._0_8_ = pTVar2;
  std::__cxx11::ostringstream::ostringstream(poVar1);
  std::operator<<((ostream *)poVar1,"Iteration count: ");
  pMVar3 = tcu::MessageBuilder::operator<<((MessageBuilder *)local_198,&this->m_iterationCount);
  tcu::MessageBuilder::operator<<(pMVar3,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar1);
  poVar1 = (ostringstream *)(local_198 + 8);
  local_198._0_8_ = pTVar2;
  std::__cxx11::ostringstream::ostringstream(poVar1);
  std::operator<<((ostream *)poVar1,"Per iteration call count: ");
  pMVar3 = tcu::MessageBuilder::operator<<((MessageBuilder *)local_198,&this->m_callCount);
  tcu::MessageBuilder::operator<<(pMVar3,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar1);
  return;
}

Assistant:

void StateChangeCallPerformanceCase::logTestCase (void)
{
	TestLog& log = m_testCtx.getLog();

	log << TestLog::Message << "Iteration count: " << m_iterationCount << TestLog::EndMessage;
	log << TestLog::Message << "Per iteration call count: " << m_callCount << TestLog::EndMessage;
}